

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O2

void __thiscall chrono::robosimian::RoboSimian::Initialize(RoboSimian *this,ChCoordsys<double> *pos)

{
  RS_Sled *this_00;
  RS_Limb *pRVar1;
  long lVar2;
  undefined1 auVar3 [16];
  long lVar4;
  string *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_100;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_f0;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_e0;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_d0;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  RS_Chassis::Initialize
            ((this->m_chassis).
             super___shared_ptr<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             pos);
  this_00 = (this->m_sled).
            super___shared_ptr<chrono::robosimian::RS_Sled,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (RS_Sled *)0x0) {
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_c0,
               &(((this->m_chassis).
                  super___shared_ptr<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->super_RS_Part).m_body.
                super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0x3fcae147ae147ae1;
    local_148._0_16_ = ZEXT816(0x3ff921fafc8b007a);
    local_148.field_2._M_allocated_capacity = 0;
    RS_Sled::Initialize(this_00,(shared_ptr<chrono::ChBodyAuxRef> *)&local_c0,
                        (ChVector<double> *)&local_128,(ChVector<double> *)&local_148);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
  }
  pRVar1 = (((this->m_limbs).
             super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_d0,
             &(((this->m_chassis).
                super___shared_ptr<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_RS_Part).m_body.
              super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
  local_128._M_dataplus._M_p = (pointer)0x3fd2c4c5974e65bf;
  local_128._M_string_length = 0x3fcacd9e83e425af;
  auVar3 = vmovhps_avx(ZEXT816(0) << 0x20,0xbff921ff2e48e8a7);
  local_128.field_2._M_allocated_capacity = 0x3fa2b020c49ba5e3;
  local_148.field_2._M_allocated_capacity = 0xbfd0c154c985f06f;
  local_148._0_16_ = auVar3;
  RS_Limb::Initialize(pRVar1,(shared_ptr<chrono::ChBodyAuxRef> *)&local_d0,
                      (ChVector<double> *)&local_128,(ChVector<double> *)&local_148,LIMB_FR,
                      this->m_wheel_mode);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0._M_refcount);
  pRVar1 = (this->m_limbs).
           super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_e0,
             &(((this->m_chassis).
                super___shared_ptr<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_RS_Part).m_body.
              super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
  local_128._M_dataplus._M_p = (pointer)0xbfd2c4c5974e65bf;
  local_128._M_string_length = 0x3fcacd9e83e425af;
  local_128.field_2._M_allocated_capacity = 0x3fa2b020c49ba5e3;
  local_148.field_2._M_allocated_capacity = 0x3fd0c154c985f06f;
  local_148._0_16_ = auVar3;
  RS_Limb::Initialize(pRVar1,(shared_ptr<chrono::ChBodyAuxRef> *)&local_e0,
                      (ChVector<double> *)&local_128,(ChVector<double> *)&local_148,LIMB_RR,
                      this->m_wheel_mode);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0._M_refcount);
  pRVar1 = (this->m_limbs).
           super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
           ._M_impl.super__Vector_impl_data._M_start[2].
           super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_f0,
             &(((this->m_chassis).
                super___shared_ptr<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_RS_Part).m_body.
              super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
  local_128._M_dataplus._M_p = (pointer)0xbfd2c4c5974e65bf;
  local_128._M_string_length = 0xbfcacd9e83e425af;
  auVar3 = vmovhps_avx(ZEXT816(0) << 0x20,0xbff921ff2e48e8a7);
  local_128.field_2._M_allocated_capacity = 0x3fa2b020c49ba5e3;
  local_148.field_2._M_allocated_capacity = 0x400709cf56eac860;
  local_148._0_16_ = auVar3;
  RS_Limb::Initialize(pRVar1,(shared_ptr<chrono::ChBodyAuxRef> *)&local_f0,
                      (ChVector<double> *)&local_128,(ChVector<double> *)&local_148,LIMB_RL,
                      this->m_wheel_mode);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0._M_refcount);
  pRVar1 = (this->m_limbs).
           super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
           ._M_impl.super__Vector_impl_data._M_start[3].
           super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_100,
             &(((this->m_chassis).
                super___shared_ptr<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_RS_Part).m_body.
              super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
  local_128._M_dataplus._M_p = (pointer)0x3fd2c4c5974e65bf;
  local_128._M_string_length = 0xbfcacd9e83e425af;
  local_128.field_2._M_allocated_capacity = 0x3fa2b020c49ba5e3;
  local_148.field_2._M_allocated_capacity = 0x400b3a24894c447c;
  local_148._0_16_ = auVar3;
  RS_Limb::Initialize(pRVar1,(shared_ptr<chrono::ChBodyAuxRef> *)&local_100,
                      (ChVector<double> *)&local_128,(ChVector<double> *)&local_148,LIMB_FL,
                      this->m_wheel_mode);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100._M_refcount);
  psVar5 = (string *)&this->field_0x108;
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    std::operator+(&local_70,&this->m_outdir,"/");
    std::operator+(&local_50,&local_70,&this->m_root);
    std::operator+(&local_b0,&local_50,"_limb");
    std::__cxx11::to_string(&local_90,(int)lVar4);
    std::operator+(&local_148,&local_b0,&local_90);
    std::operator+(&local_128,&local_148,".dat");
    std::ofstream::open(psVar5,(_Ios_Openmode)&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    lVar2 = *(long *)psVar5;
    *(undefined8 *)(psVar5 + *(long *)(lVar2 + -0x18) + 8) = 7;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(psVar5 + lVar2 + 0x18) = *(uint *)(psVar5 + lVar2 + 0x18) & 0xfffffefb | 0x100;
    psVar5 = psVar5 + 0x200;
  }
  return;
}

Assistant:

void RoboSimian::Initialize(const ChCoordsys<>& pos) {
    m_chassis->Initialize(pos);

    if (m_sled)
        m_sled->Initialize(m_chassis->m_body, ChVector<>(0.0, 0.0, 0.21), ChVector<>(1.570796, 0, 0));

    m_limbs[FR]->Initialize(m_chassis->m_body, ChVector<>(+0.29326, +0.20940, 0.03650),
                            ChVector<>(0.00000, -1.57080, -0.26180), CollisionFamily::LIMB_FR, m_wheel_mode);
    m_limbs[RR]->Initialize(m_chassis->m_body, ChVector<>(-0.29326, +0.20940, 0.03650),
                            ChVector<>(0.00000, -1.57080, +0.26180), CollisionFamily::LIMB_RR, m_wheel_mode);
    m_limbs[RL]->Initialize(m_chassis->m_body, ChVector<>(-0.29326, -0.20940, 0.03650),
                            ChVector<>(0.00000, -1.57080, 2.87979), CollisionFamily::LIMB_RL, m_wheel_mode);
    m_limbs[FL]->Initialize(m_chassis->m_body, ChVector<>(+0.29326, -0.20940, 0.03650),
                            ChVector<>(0.00000, -1.57080, 3.40339), CollisionFamily::LIMB_FL, m_wheel_mode);

    ////m_wheel_left->Initialize(m_chassis->m_body, ChVector<>(-0.42943, -0.19252, 0.06380),
    ////                         ChVector<>(0.00000, +1.57080, -1.57080));
    ////m_wheel_right->Initialize(m_chassis->m_body, ChVector<>(-0.42943, +0.19252, 0.06380),
    ////                          ChVector<>(0.00000, -1.57080, -1.57080));

    // Create output files
    for (int i = 0; i < 4; i++) {
        m_outf[i].open(m_outdir + "/" + m_root + "_limb" + std::to_string(i) + ".dat");
        m_outf[i].precision(7);
        m_outf[i] << std::scientific;
    }
}